

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32(char *s,size_t len)

{
  uint32_t uVar1;
  char *in_RSI;
  size_t in_stack_ffffffffffffffe8;
  
  farmhash32_nt(in_RSI,in_stack_ffffffffffffffe8);
  uVar1 = debug_tweak32(0);
  return uVar1;
}

Assistant:

uint32_t farmhash32(const char* s, size_t len) {
  return debug_tweak32(

#if CAN_USE_SSE41 && x86_64
      farmhash32_nt(s, len)
#elif CAN_USE_SSE42 && CAN_USE_AESNI
      farmhash32_su(s, len)
#elif CAN_USE_SSE41 && CAN_USE_SSE42
      farmhash32_sa(s, len)
#else
      farmhash32_mk(s, len)
#endif

  );
}